

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kliveness.c
# Opt level: O2

void modifyAigToApplySafetyInvar(Aig_Man_t *pAig,int csTarget,int safetyInvarPO)

{
  Aig_Obj_t *pAVar1;
  Aig_Obj_t *pObj;
  
  pAVar1 = Aig_ManCo(pAig,safetyInvarPO);
  pAVar1 = pAVar1->pFanin0;
  pObj = Aig_ManCo(pAig,csTarget);
  pAVar1 = Aig_And(pAig,pAVar1,pObj->pFanin0);
  Aig_ObjPatchFanin0(pAig,pObj,pAVar1);
  return;
}

Assistant:

void modifyAigToApplySafetyInvar(Aig_Man_t *pAig, int csTarget, int safetyInvarPO)
{
	Aig_Obj_t *pObjPOSafetyInvar, *pObjSafetyInvar;
	Aig_Obj_t *pObjPOCSTarget, *pObjCSTarget;
	Aig_Obj_t *pObjCSTargetNew;

	pObjPOSafetyInvar = Aig_ManCo( pAig, safetyInvarPO );
	pObjSafetyInvar =  Aig_NotCond((Aig_Obj_t *)Aig_ObjFanin0(pObjPOSafetyInvar), Aig_ObjFaninC0(pObjPOSafetyInvar));	
	pObjPOCSTarget = Aig_ManCo( pAig, csTarget );
	pObjCSTarget = Aig_NotCond((Aig_Obj_t *)Aig_ObjFanin0(pObjPOCSTarget), Aig_ObjFaninC0(pObjPOCSTarget));	

	pObjCSTargetNew = Aig_And( pAig, pObjSafetyInvar, pObjCSTarget );
	Aig_ObjPatchFanin0( pAig, pObjPOCSTarget, pObjCSTargetNew );
}